

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegGetCounter(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegCounter *pxVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = ctxt->maxCounters;
  if (iVar1 <= ctxt->nbCounters) {
    if (iVar1 < 1) {
      uVar4 = 4;
    }
    else {
      uVar4 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        uVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          uVar4 = 1000000000;
        }
      }
    }
    if (((int)uVar4 < 0) ||
       (pxVar2 = (xmlRegCounter *)(*xmlRealloc)(ctxt->counters,(ulong)uVar4 << 3),
       pxVar2 == (xmlRegCounter *)0x0)) {
      ctxt->error = 2;
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                          (xmlError *)0x0);
      return -1;
    }
    ctxt->counters = pxVar2;
    ctxt->maxCounters = uVar4;
  }
  pxVar2 = ctxt->counters;
  iVar1 = ctxt->nbCounters;
  pxVar2[iVar1].min = -1;
  pxVar2[iVar1].max = -1;
  ctxt->nbCounters = iVar1 + 1;
  return iVar1;
}

Assistant:

static int
xmlRegGetCounter(xmlRegParserCtxtPtr ctxt) {
    if (ctxt->nbCounters >= ctxt->maxCounters) {
	xmlRegCounter *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxCounters, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	tmp = xmlRealloc(ctxt->counters, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	ctxt->counters = tmp;
	ctxt->maxCounters = newSize;
    }
    ctxt->counters[ctxt->nbCounters].min = -1;
    ctxt->counters[ctxt->nbCounters].max = -1;
    return(ctxt->nbCounters++);
}